

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

uint32_t nsync_spin_test_and_set_(nsync_atomic_uint32_ *w,uint32_t test,uint32_t set,uint32_t clear)

{
  nsync_atomic_uint32_ nVar1;
  bool bVar2;
  undefined4 local_24;
  undefined4 local_20;
  uint32_t old;
  uint attempts;
  uint32_t clear_local;
  uint32_t set_local;
  uint32_t test_local;
  nsync_atomic_uint32_ *w_local;
  
  local_20 = 0;
  local_24 = *w;
  while( true ) {
    bVar2 = true;
    if ((local_24 & test) == 0) {
      LOCK();
      nVar1 = *w;
      if (local_24 == nVar1) {
        *w = (local_24 | set) & ~clear;
      }
      UNLOCK();
      bVar2 = local_24 != nVar1;
    }
    if (!bVar2) break;
    local_20 = nsync_spin_delay_(local_20);
    local_24 = *w;
  }
  return local_24;
}

Assistant:

uint32_t nsync_spin_test_and_set_ (nsync_atomic_uint32_ *w, uint32_t test,
				   uint32_t set, uint32_t clear) {
	unsigned attempts = 0; /* CV_SPINLOCK retry count */
	uint32_t old = ATM_LOAD (w);
	while ((old & test) != 0 || !ATM_CAS_ACQ (w, old, (old | set) & ~clear)) {
		attempts = nsync_spin_delay_ (attempts);
		old = ATM_LOAD (w);
	}
	return (old);
}